

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O1

CURLcode get_args(OperationConfig *config,size_t i)

{
  OperationConfig *pOVar1;
  CURLcode CVar2;
  char *pcVar3;
  
  pOVar1 = config->next;
  if ((((config->userpwd == (char *)0x0) || (config->oauth_bearer != (char *)0x0)) ||
      (CVar2 = checkpasswd("host",i,pOVar1 == (OperationConfig *)0x0,&config->userpwd),
      CVar2 == CURLE_OK)) &&
     (((config->proxyuserpwd == (char *)0x0 ||
       (CVar2 = checkpasswd("proxy",i,pOVar1 == (OperationConfig *)0x0,&config->proxyuserpwd),
       CVar2 == CURLE_OK)) && (CVar2 = CURLE_OK, config->useragent == (char *)0x0)))) {
    pcVar3 = strdup("curl/7.60.0-DEV");
    config->useragent = pcVar3;
    if (pcVar3 == (char *)0x0) {
      helpf(config->global->errors,"out of memory\n");
      CVar2 = CURLE_OUT_OF_MEMORY;
    }
  }
  return CVar2;
}

Assistant:

CURLcode get_args(struct OperationConfig *config, const size_t i)
{
  CURLcode result = CURLE_OK;
  bool last = (config->next ? FALSE : TRUE);

  /* Check we have a password for the given host user */
  if(config->userpwd && !config->oauth_bearer) {
    result = checkpasswd("host", i, last, &config->userpwd);
    if(result)
      return result;
  }

  /* Check we have a password for the given proxy user */
  if(config->proxyuserpwd) {
    result = checkpasswd("proxy", i, last, &config->proxyuserpwd);
    if(result)
      return result;
  }

  /* Check we have a user agent */
  if(!config->useragent) {
    config->useragent = my_useragent();
    if(!config->useragent) {
      helpf(config->global->errors, "out of memory\n");
      result = CURLE_OUT_OF_MEMORY;
    }
  }

  return result;
}